

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O1

mz_bool tdefl_compress_normal(tdefl_compressor *d)

{
  mz_uint *pmVar1;
  mz_uint8 *pmVar2;
  mz_uint16 *pmVar3;
  byte bVar4;
  byte bVar5;
  short sVar6;
  ushort uVar7;
  tdefl_flush tVar8;
  mz_uint mVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  long lVar24;
  uint uVar25;
  int iVar26;
  mz_uint mVar27;
  long lVar28;
  mz_uint8 *pmVar29;
  byte *pbVar30;
  size_t sVar31;
  ulong uVar32;
  mz_uint8 *pmVar33;
  bool bVar34;
  char cVar35;
  uint local_ac;
  uint local_90;
  int local_48;
  int local_40;
  ulong uVar23;
  
  pbVar30 = d->m_pSrc;
  tVar8 = d->m_flush;
  pmVar2 = d->m_dict;
  local_40 = (int)d + 0x92aa;
  sVar31 = d->m_src_buf_left;
  do {
    if ((sVar31 == 0) && ((tVar8 == TDEFL_NO_FLUSH || (d->m_lookahead_size == 0)))) {
      uVar32 = 0;
      goto LAB_0013388b;
    }
    mVar27 = d->m_lookahead_size;
    uVar12 = d->m_dict_size;
    if (uVar12 + mVar27 < 2) {
      if (sVar31 == 0) {
        uVar32 = 0;
      }
      else {
        uVar15 = d->m_lookahead_size;
        iVar26 = 0x102 - uVar15;
        if (0x102 < uVar15) {
          iVar26 = 0;
        }
        uVar20 = 0;
        uVar32 = sVar31;
        do {
          iVar21 = (int)uVar20;
          if (iVar26 == iVar21) goto LAB_0013313f;
          bVar4 = pbVar30[uVar20];
          mVar27 = d->m_lookahead_pos;
          uVar14 = uVar15 + iVar21 + mVar27 & 0x7fff;
          d->m_dict[uVar14] = bVar4;
          if (uVar14 < 0x101) {
            d->m_dict[(ulong)uVar14 + 0x8000] = bVar4;
          }
          d->m_lookahead_size = uVar15 + iVar21 + 1;
          if (2 < uVar12 + uVar15 + 1 + iVar21) {
            uVar25 = (uVar15 - 2) + iVar21 + mVar27 & 0x7fff;
            uVar14 = (uint)bVar4 ^ (uint)d->m_dict[(mVar27 + uVar15 + iVar21) - 1 & 0x7fff] << 5 ^
                     (d->m_dict[uVar25] & 0x1f) << 10;
            d->m_next[uVar25] = d->m_hash[uVar14];
            d->m_hash[uVar14] = ((short)mVar27 + (short)(uVar15 + iVar21)) - 2;
          }
          uVar20 = uVar20 + 1;
          uVar32 = uVar32 - 1;
        } while (sVar31 != uVar20);
        uVar32 = 0;
LAB_0013313f:
        pbVar30 = pbVar30 + uVar20;
      }
    }
    else {
      mVar9 = d->m_lookahead_pos;
      uVar15 = (mVar9 + mVar27) - 2;
      bVar4 = d->m_dict[uVar15 & 0x7fff];
      bVar5 = d->m_dict[(mVar9 + mVar27) - 1 & 0x7fff];
      uVar20 = sVar31 & 0xffffffff;
      if (0x102 - mVar27 <= sVar31) {
        uVar20 = (ulong)(0x102 - mVar27);
      }
      uVar32 = sVar31 - uVar20;
      d->m_lookahead_size = (int)uVar20 + mVar27;
      if ((int)uVar20 != 0) {
        uVar14 = mVar9 + mVar27;
        uVar18 = (ulong)((uint)bVar4 << 5 ^ (uint)bVar5);
        do {
          uVar14 = uVar14 & 0x7fff;
          bVar4 = *pbVar30;
          d->m_dict[uVar14] = bVar4;
          if (uVar14 < 0x101) {
            d->m_dict[(ulong)uVar14 + 0x8000] = bVar4;
          }
          pbVar30 = pbVar30 + 1;
          uVar18 = (ulong)(((uint)uVar18 & 0x3ff) << 5 ^ (uint)bVar4);
          d->m_next[uVar15 & 0x7fff] = d->m_hash[uVar18];
          d->m_hash[uVar18] = (mz_uint16)uVar15;
          uVar14 = uVar14 + 1;
          uVar15 = uVar15 + 1;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
    }
    uVar15 = d->m_lookahead_size;
    uVar14 = 0x8000 - uVar15;
    if (uVar12 <= 0x8000 - uVar15) {
      uVar14 = uVar12;
    }
    d->m_dict_size = uVar14;
    cVar35 = '\x03';
    if (tVar8 != TDEFL_NO_FLUSH || 0x101 < uVar15) {
      uVar18 = (ulong)uVar15;
      uVar12 = d->m_saved_match_len;
      uVar20 = (ulong)uVar12;
      if (uVar12 == 0) {
        uVar20 = 2;
      }
      uVar11 = (uint)uVar20;
      uVar25 = d->m_flags;
      uVar10 = d->m_lookahead_pos;
      uVar22 = uVar10 & 0x7fff;
      uVar23 = (ulong)uVar22;
      if ((uVar25 & 0x90000) == 0) {
        if (uVar11 < uVar15) {
          local_48 = (int)pmVar2 + uVar22;
          uVar17 = (uVar22 + uVar11) - 1;
          mVar27 = d->m_max_probes[0x1f < uVar11];
          local_ac = 0;
          uVar13 = uVar23;
          do {
            sVar6 = *(short *)(pmVar2 + uVar17);
            uVar11 = (uint)uVar20;
            iVar26 = uVar11 - 1;
LAB_0013327a:
            do {
              do {
                mVar27 = mVar27 - 1;
                if ((mVar27 == 0) || (uVar7 = d->m_next[uVar13], uVar7 == 0)) goto LAB_001334ce;
                uVar17 = uVar10 - uVar7;
                uVar19 = uVar17 & 0xffff;
                if (uVar14 < (uVar17 & 0xffff)) goto LAB_001334ce;
                uVar17 = uVar7 & 0x7fff;
                uVar13 = (ulong)uVar17;
                if (*(short *)(pmVar2 + (iVar26 + uVar17)) != sVar6) {
                  uVar7 = d->m_next[uVar13];
                  if (uVar7 == 0) goto LAB_001334ce;
                  uVar17 = uVar10 - uVar7;
                  uVar19 = uVar17 & 0xffff;
                  if (uVar14 < (uVar17 & 0xffff)) goto LAB_001334ce;
                  uVar17 = uVar7 & 0x7fff;
                  uVar13 = (ulong)uVar17;
                  if (*(short *)(pmVar2 + (iVar26 + uVar17)) != sVar6) {
                    uVar7 = d->m_next[uVar13];
                    if (uVar7 == 0) goto LAB_001334ce;
                    uVar17 = uVar10 - uVar7;
                    uVar19 = uVar17 & 0xffff;
                    if (uVar14 < (uVar17 & 0xffff)) goto LAB_001334ce;
                    uVar17 = uVar7 & 0x7fff;
                    uVar13 = (ulong)uVar17;
                    if (*(short *)(pmVar2 + (iVar26 + uVar17)) != sVar6) goto LAB_0013327a;
                  }
                }
                if (uVar19 == 0) goto LAB_001334ce;
              } while (*(short *)(pmVar2 + uVar13) != *(short *)(pmVar2 + uVar23));
              pmVar29 = d->m_dict + uVar13 + 0x100;
              lVar28 = 0;
              do {
                if (*(short *)(d->m_dict + lVar28 + uVar23 + 2) !=
                    *(short *)(d->m_dict + lVar28 + uVar13 + 2)) {
                  lVar24 = 0xca;
LAB_00133417:
                  pmVar29 = (mz_uint8 *)((long)d->m_max_probes + lVar24 + uVar13 + lVar28 + -0x14);
                  bVar34 = false;
                  pmVar33 = (mz_uint8 *)((long)d->m_max_probes + lVar24 + lVar28 + uVar23 + -0x14);
                  break;
                }
                if (*(short *)(d->m_dict + lVar28 + uVar23 + 4) !=
                    *(short *)(d->m_dict + lVar28 + uVar13 + 4)) {
                  lVar24 = 0xcc;
                  goto LAB_00133417;
                }
                if (*(short *)(d->m_dict + lVar28 + uVar23 + 6) !=
                    *(short *)(d->m_dict + lVar28 + uVar13 + 6)) {
                  lVar24 = 0xce;
                  goto LAB_00133417;
                }
                bVar34 = *(short *)(d->m_dict + lVar28 + uVar23 + 8) ==
                         *(short *)(d->m_dict + lVar28 + uVar13 + 8);
                if (!bVar34) {
                  pmVar29 = d->m_dict + uVar13 + lVar28 + 8;
                  pmVar33 = d->m_dict + lVar28 + uVar23 + 8;
                  break;
                }
                lVar28 = lVar28 + 8;
                pmVar33 = d->m_dict + uVar23 + 0x100;
              } while ((int)lVar28 != 0x100);
              if (bVar34) {
                local_ac = uVar19;
                uVar11 = uVar15;
                if (0x101 < uVar15) {
                  uVar11 = 0x102;
                }
                goto LAB_001334ce;
              }
              uVar17 = (uint)(*pmVar33 == *pmVar29) | (int)pmVar33 - local_48 & 0xfffffffeU;
            } while (uVar17 <= uVar11);
            uVar20 = (ulong)uVar17;
            if (uVar15 <= uVar17) {
              uVar20 = uVar18;
            }
            uVar11 = (uint)uVar20;
            local_ac = uVar19;
            if (uVar15 <= uVar17) goto LAB_001334ce;
            uVar17 = (uVar22 - 1) + uVar11;
          } while( true );
        }
LAB_001334a5:
        local_ac = 0;
      }
      else {
        if ((uVar25 >> 0x13 & 1) != 0 || uVar14 == 0) goto LAB_001334a5;
        if (uVar18 == 0) {
          uVar20 = 0;
        }
        else {
          uVar13 = 0;
          do {
            uVar20 = uVar13;
            if (d->m_dict[uVar22 + (int)uVar13] != d->m_dict[uVar10 - 1 & 0x7fff]) break;
            uVar13 = uVar13 + 1;
            uVar20 = uVar18;
          } while (uVar18 != uVar13);
        }
        uVar11 = (uint)uVar20;
        local_ac = (uint)(2 < uVar11);
        if (2 >= uVar11) {
          uVar11 = 0;
        }
      }
LAB_001334ce:
      if (((uVar11 == 3 && 0x1fff < local_ac) || (uVar22 == local_ac)) ||
         (((uVar25 >> 0x11 & 1) != 0 && (uVar11 < 6)))) {
        local_ac = 0;
        uVar11 = 0;
      }
      if (uVar12 == 0) {
        if (local_ac == 0) {
          bVar4 = d->m_dict[uVar23];
          d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
          pbVar16 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pbVar16 + 1;
          *pbVar16 = bVar4;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar29 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar29 + 1;
            d->m_pLZ_flags = pmVar29;
          }
          pmVar3 = d->m_huff_count[0] + bVar4;
          *pmVar3 = *pmVar3 + 1;
LAB_001337d3:
          uVar11 = 1;
        }
        else {
          if (((d->m_greedy_parsing == 0) && ((uVar25 >> 0x10 & 1) == 0)) && (uVar11 < 0x80))
          goto LAB_001337c1;
          d->m_total_lz_bytes = d->m_total_lz_bytes + uVar11;
          *d->m_pLZ_code_buf = (mz_uint8)(uVar11 - 3);
          uVar12 = local_ac - 1;
          d->m_pLZ_code_buf[1] = (mz_uint8)uVar12;
          d->m_pLZ_code_buf[2] = (mz_uint8)(uVar12 >> 8);
          d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar29 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar29 + 1;
            d->m_pLZ_flags = pmVar29;
          }
          pbVar16 = "" + (uVar12 >> 8 & 0x7f);
          if (local_ac < 0x201) {
            pbVar16 = "" + (uVar12 & 0x1ff);
          }
          pmVar3 = d->m_huff_count[1] + *pbVar16;
          *pmVar3 = *pmVar3 + 1;
          if (2 < uVar11) {
            pmVar3 = d->m_huff_count[0] + s_tdefl_len_sym[uVar11 - 3];
            *pmVar3 = *pmVar3 + 1;
          }
        }
      }
      else {
        if (uVar12 < uVar11) {
          uVar12 = d->m_saved_lit;
          d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
          pmVar29 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pmVar29 + 1;
          *pmVar29 = (mz_uint8)uVar12;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar29 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar29 + 1;
            d->m_pLZ_flags = pmVar29;
          }
          pmVar3 = d->m_huff_count[0] + (uVar12 & 0xff);
          *pmVar3 = *pmVar3 + 1;
          if (uVar11 < 0x80) {
LAB_001337c1:
            d->m_saved_lit = (uint)d->m_dict[uVar23];
            d->m_saved_match_dist = local_ac;
            d->m_saved_match_len = uVar11;
            goto LAB_001337d3;
          }
          d->m_total_lz_bytes = d->m_total_lz_bytes + uVar11;
          *d->m_pLZ_code_buf = (mz_uint8)(uVar11 - 3);
          local_ac = local_ac - 1;
          d->m_pLZ_code_buf[1] = (mz_uint8)local_ac;
          d->m_pLZ_code_buf[2] = (mz_uint8)(local_ac >> 8);
          d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar29 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar29 + 1;
            d->m_pLZ_flags = pmVar29;
          }
          pbVar16 = "" + (local_ac >> 8 & 0x7f);
          if (local_ac < 0x200) {
            pbVar16 = "" + (local_ac & 0x1ff);
          }
          pmVar3 = d->m_huff_count[1] + *pbVar16;
          *pmVar3 = *pmVar3 + 1;
          pmVar3 = d->m_huff_count[0] + s_tdefl_len_sym[uVar11 - 3];
          *pmVar3 = *pmVar3 + 1;
        }
        else {
          mVar27 = d->m_saved_match_dist;
          d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
          *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
          uVar15 = mVar27 - 1;
          d->m_pLZ_code_buf[1] = (mz_uint8)uVar15;
          d->m_pLZ_code_buf[2] = (mz_uint8)(uVar15 >> 8);
          d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar29 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar29 + 1;
            d->m_pLZ_flags = pmVar29;
          }
          pbVar16 = "" + (uVar15 >> 8 & 0x7f);
          if (uVar15 < 0x200) {
            pbVar16 = "" + (uVar15 & 0x1ff);
          }
          pmVar3 = d->m_huff_count[1] + *pbVar16;
          *pmVar3 = *pmVar3 + 1;
          if (2 < uVar12) {
            pmVar3 = d->m_huff_count[0] + s_tdefl_len_sym[uVar12 - 3];
            *pmVar3 = *pmVar3 + 1;
          }
          uVar11 = d->m_saved_match_len - 1;
        }
        d->m_saved_match_len = 0;
      }
      d->m_lookahead_pos = d->m_lookahead_pos + uVar11;
      d->m_lookahead_size = d->m_lookahead_size - uVar11;
      uVar11 = uVar11 + d->m_dict_size;
      if (0x7fff < uVar11) {
        uVar11 = 0x8000;
      }
      d->m_dict_size = uVar11;
      if (d->m_pLZ_code_buf <= d->m_lz_code_buf + 0xfff8) {
        cVar35 = '\0';
        if ((d->m_total_lz_bytes < 0x7c01) ||
           (((uint)(((int)d->m_pLZ_code_buf - local_40) * 0x73) >> 7 < d->m_total_lz_bytes &&
            ((d->m_flags & 0x80000) == 0)))) goto LAB_00133850;
      }
      d->m_pSrc = pbVar30;
      d->m_src_buf_left = uVar32;
      uVar12 = tdefl_flush_block(d,0);
      cVar35 = uVar12 != 0;
      if ((bool)cVar35) {
        local_90 = ~uVar12 >> 0x1f;
      }
    }
LAB_00133850:
    sVar31 = uVar32;
  } while (cVar35 == '\0');
  if (cVar35 == '\x03') {
LAB_0013388b:
    d->m_pSrc = pbVar30;
    d->m_src_buf_left = uVar32;
    local_90 = 1;
  }
  return local_90;
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor* d) {
  const mz_uint8* pSrc = d->m_pSrc;
  size_t src_buf_left = d->m_src_buf_left;
  tdefl_flush flush = d->m_flush;

  while ((src_buf_left) || ((flush) && (d->m_lookahead_size))) {
    mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
    // Update dictionary and hash chains. Keeps the lookahead size equal to TDEFL_MAX_MATCH_LEN.
    if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1)) {
      mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK, ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
      mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
      mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
      const mz_uint8* pSrc_end = pSrc + num_bytes_to_process;
      src_buf_left -= num_bytes_to_process;
      d->m_lookahead_size += num_bytes_to_process;
      while (pSrc != pSrc_end) {
        mz_uint8 c = *pSrc++;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
        d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
        d->m_hash[hash] = (mz_uint16)(ins_pos);
        dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
        ins_pos++;
      }
    } else {
      while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN)) {
        mz_uint8 c = *pSrc++;
        mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
        src_buf_left--;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN) {
          mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
          mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << (TDEFL_LZ_HASH_SHIFT * 2)) ^ (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
          d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
          d->m_hash[hash] = (mz_uint16)(ins_pos);
        }
      }
    }
    d->m_dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
    if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
      break;

    // Simple lazy/greedy parsing state machine.
    len_to_move = 1;
    cur_match_dist = 0;
    cur_match_len = d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
    cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
    if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS)) {
      if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))) {
        mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
        cur_match_len = 0;
        while (cur_match_len < d->m_lookahead_size) {
          if (d->m_dict[cur_pos + cur_match_len] != c)
            break;
          cur_match_len++;
        }
        if (cur_match_len < TDEFL_MIN_MATCH_LEN)
          cur_match_len = 0;
        else
          cur_match_dist = 1;
      }
    } else {
      tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size, d->m_lookahead_size, &cur_match_dist, &cur_match_len);
    }
    if (((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)) || (cur_pos == cur_match_dist) || ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5))) {
      cur_match_dist = cur_match_len = 0;
    }
    if (d->m_saved_match_len) {
      if (cur_match_len > d->m_saved_match_len) {
        tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
        if (cur_match_len >= 128) {
          tdefl_record_match(d, cur_match_len, cur_match_dist);
          d->m_saved_match_len = 0;
          len_to_move = cur_match_len;
        } else {
          d->m_saved_lit = d->m_dict[cur_pos];
          d->m_saved_match_dist = cur_match_dist;
          d->m_saved_match_len = cur_match_len;
        }
      } else {
        tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
        len_to_move = d->m_saved_match_len - 1;
        d->m_saved_match_len = 0;
      }
    } else if (!cur_match_dist)
      tdefl_record_literal(d, d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
    else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) || (cur_match_len >= 128)) {
      tdefl_record_match(d, cur_match_len, cur_match_dist);
      len_to_move = cur_match_len;
    } else {
      d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
      d->m_saved_match_dist = cur_match_dist;
      d->m_saved_match_len = cur_match_len;
    }
    // Move the lookahead forward by len_to_move bytes.
    d->m_lookahead_pos += len_to_move;
    MZ_ASSERT(d->m_lookahead_size >= len_to_move);
    d->m_lookahead_size -= len_to_move;
    d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, TDEFL_LZ_DICT_SIZE);
    // Check if it's time to flush the current LZ codes to the internal output buffer.
    if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
        ((d->m_total_lz_bytes > 31 * 1024) && (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >= d->m_total_lz_bytes) || (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))) {
      int n;
      d->m_pSrc = pSrc;
      d->m_src_buf_left = src_buf_left;
      if ((n = tdefl_flush_block(d, 0)) != 0)
        return (n < 0) ? MZ_FALSE : MZ_TRUE;
    }
  }

  d->m_pSrc = pSrc;
  d->m_src_buf_left = src_buf_left;
  return MZ_TRUE;
}